

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O3

Abc_Cex_t * Pdr_ManDeriveCex(Pdr_Man_t *p)

{
  uint uVar1;
  Pdr_Set_t *pPVar2;
  Abc_Cex_t *p_00;
  Pdr_Obl_t *pPVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int nFrames;
  
  pPVar3 = p->pQueue;
  iVar5 = 0;
  nFrames = 0;
  if (pPVar3 != (Pdr_Obl_t *)0x0) {
    nFrames = 0;
    do {
      nFrames = nFrames + 1;
      pPVar3 = pPVar3->pNext;
    } while (pPVar3 != (Pdr_Obl_t *)0x0);
  }
  p_00 = Abc_CexAlloc(p->pAig->nRegs,p->pAig->nTruePis,nFrames);
  p_00->iPo = p->iOutCur;
  p_00->iFrame = nFrames + -1;
  pPVar3 = p->pQueue;
  if (pPVar3 != (Pdr_Obl_t *)0x0) {
    iVar5 = 0;
    do {
      pPVar2 = pPVar3->pState;
      lVar6 = (long)pPVar2->nLits;
      iVar4 = pPVar2->nTotal;
      if (pPVar2->nLits < iVar4) {
        do {
          uVar1 = *(uint *)(&pPVar2->field_0x14 + lVar6 * 4);
          if ((int)uVar1 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          if ((uVar1 & 1) == 0) {
            if ((int)(uVar1 >> 1) < p_00->nPis) {
              iVar4 = p_00->nPis * iVar5 + (uVar1 >> 1) + p_00->nRegs;
              (&p_00[1].iPo)[iVar4 >> 5] = (&p_00[1].iPo)[iVar4 >> 5] | 1 << ((byte)iVar4 & 0x1f);
              iVar4 = pPVar2->nTotal;
            }
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < iVar4);
      }
      iVar5 = iVar5 + 1;
      pPVar3 = pPVar3->pNext;
    } while (pPVar3 != (Pdr_Obl_t *)0x0);
  }
  if (iVar5 == nFrames) {
    iVar5 = Saig_ManVerifyCex(p->pAig,p_00);
    if (iVar5 == 0) {
      printf("CEX for output %d is not valid.\n",(ulong)(uint)p->iOutCur);
    }
    return p_00;
  }
  __assert_fail("f == nFrames",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrMan.c"
                ,0x1af,"Abc_Cex_t *Pdr_ManDeriveCex(Pdr_Man_t *)");
}

Assistant:

Abc_Cex_t * Pdr_ManDeriveCex( Pdr_Man_t * p )
{
    Abc_Cex_t * pCex;
    Pdr_Obl_t * pObl;
    int i, f, Lit, nFrames = 0;
    // count the number of frames
    for ( pObl = p->pQueue; pObl; pObl = pObl->pNext )
        nFrames++;
    // create the counter-example
    pCex = Abc_CexAlloc( Aig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), nFrames );
    pCex->iPo    = p->iOutCur;
    pCex->iFrame = nFrames-1;
    for ( pObl = p->pQueue, f = 0; pObl; pObl = pObl->pNext, f++ )
        for ( i = pObl->pState->nLits; i < pObl->pState->nTotal; i++ )
        {
            Lit = pObl->pState->Lits[i];
            if ( Abc_LitIsCompl(Lit) )
                continue;
            if ( Abc_Lit2Var(Lit) >= pCex->nPis ) // allows PPI literals to be thrown away
                continue;
            assert( Abc_Lit2Var(Lit) < pCex->nPis );
            Abc_InfoSetBit( pCex->pData, pCex->nRegs + f * pCex->nPis + Abc_Lit2Var(Lit) );
        }
    assert( f == nFrames );
    if ( !Saig_ManVerifyCex(p->pAig, pCex) )
        printf( "CEX for output %d is not valid.\n", p->iOutCur );
    return pCex;
}